

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkState.cpp
# Opt level: O3

string * __thiscall
iDynTree::LinkWrenches::toString_abi_cxx11_
          (string *__return_storage_ptr__,LinkWrenches *this,Model *model)

{
  string *psVar1;
  long lVar2;
  ostream *poVar3;
  long linkIndex;
  long lVar4;
  stringstream ss;
  string local_208;
  string local_1e8;
  string *local_1c8;
  Model *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c8 = __return_storage_ptr__;
  local_1c0 = model;
  std::__cxx11::stringstream::stringstream(local_1b8);
  lVar2 = (long)(this->m_linkWrenches).
                super__Vector_base<iDynTree::Wrench,_std::allocator<iDynTree::Wrench>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->m_linkWrenches).
                super__Vector_base<iDynTree::Wrench,_std::allocator<iDynTree::Wrench>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar2 != 0) {
    lVar2 = (lVar2 >> 3) * 0x6db6db6db6db6db7;
    lVar4 = 8;
    linkIndex = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Wrench for link ",0x10);
      Model::getLinkName_abi_cxx11_(&local_1e8,local_1c0,linkIndex);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
      SpatialVector<iDynTree::SpatialForceVector>::toString_abi_cxx11_
                (&local_208,
                 (SpatialVector<iDynTree::SpatialForceVector> *)
                 (&((this->m_linkWrenches).
                    super__Vector_base<iDynTree::Wrench,_std::allocator<iDynTree::Wrench>_>._M_impl.
                    super__Vector_impl_data._M_start)->super_SpatialForceVector + lVar4));
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_208._M_dataplus._M_p,local_208._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      linkIndex = linkIndex + 1;
      lVar4 = lVar4 + 0x38;
    } while (lVar2 + (ulong)(lVar2 == 0) != linkIndex);
  }
  psVar1 = local_1c8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

std::string LinkWrenches::toString(const Model& model) const
{
   std::stringstream ss;

    size_t nrOfLinks = this->getNrOfLinks();
    for(size_t l=0; l < nrOfLinks; l++)
    {
        ss << "Wrench for link " << model.getLinkName(l) << ":" << this->operator()(l).toString() << std::endl;
    }
    return ss.str();
}